

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

RootBlock * __thiscall SQCompilation::SQParser::parse(SQParser *this)

{
  Arena *this_00;
  long lVar1;
  int iVar2;
  Chunk *pCVar3;
  Block *this_01;
  Statement *stmt;
  
  this_00 = this->_astArena;
  pCVar3 = Arena::findChunk(this_00,0x38);
  this_01 = (Block *)pCVar3->_ptr;
  pCVar3->_ptr = (uint8_t *)(this_01 + 1);
  *(undefined4 *)&this_01->field_0x18 = 0;
  *(undefined4 *)&this_01->field_0x8 = 0xffffffff;
  *(undefined4 *)&this_01->field_0xc = 0xffffffff;
  *(undefined4 *)&this_01->field_0x10 = 0xffffffff;
  *(undefined4 *)&this_01->field_0x14 = 0xffffffff;
  this_01->_is_root = true;
  this_01->_is_body = false;
  (this_01->_statements)._arena = this_00;
  (this_01->_statements)._vals = (Statement **)0x0;
  (this_01->_statements)._size = 0;
  (this_01->_statements)._allocated = 0;
  *(undefined ***)this_01 = &PTR__ArenaObj_001a2748;
  iVar2 = _setjmp((__jmp_buf_tag *)this->_ctx->_errorjmp);
  if (iVar2 == 0) {
    Lex(this);
    *(int *)&this_01->field_0x8 = (int)(this->_lex)._tokenline;
    *(int *)&this_01->field_0xc = (int)(this->_lex)._tokencolumn;
    lVar1 = this->_token;
    while (0 < lVar1) {
      stmt = parseStatement(this,false);
      Block::addStatement(this_01,stmt);
      lVar1 = (this->_lex)._prevtoken;
      if ((lVar1 != 0x3b) && (lVar1 != 0x7d)) {
        OptionalSemicolon(this);
      }
      lVar1 = this->_token;
    }
    *(int *)&this_01->field_0x10 = (int)(this->_lex)._currentline;
    *(int *)&this_01->field_0x14 = (int)(this->_lex)._currentcolumn;
  }
  else {
    this_01 = (Block *)0x0;
  }
  return (RootBlock *)this_01;
}

Assistant:

RootBlock* SQParser::parse()
{
    RootBlock *rootBlock = newNode<RootBlock>(arena());

    if(setjmp(_ctx.errorJump()) == 0) {
        Lex();
        rootBlock->setLineStartPos(line());
        rootBlock->setColumnStartPos(column());
        while(_token > 0){
            rootBlock->addStatement(parseStatement());
            if(_lex._prevtoken != _SC('}') && _lex._prevtoken != _SC(';')) OptionalSemicolon();
        }
        rootBlock->setLineEndPos(_lex._currentline);
        rootBlock->setColumnEndPos(_lex._currentcolumn);
    }
    else {
        return NULL;
    }

    return rootBlock;
}